

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutations.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
wasm::makeReversed(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                  vector<unsigned_int,_std::allocator<unsigned_int>_> *original)

{
  pointer puVar1;
  pointer puVar2;
  Index i;
  uint uVar3;
  size_type __new_size;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (long)(original->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(original->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,__new_size);
  puVar1 = (original->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0; uVar3 < __new_size; uVar3 = uVar3 + 1) {
    puVar2[puVar1[uVar3]] = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Index> makeReversed(std::vector<Index>& original) {
  std::vector<Index> ret;
  auto num = original.size();
  ret.resize(num);
  for (Index i = 0; i < num; i++) {
    ret[original[i]] = i;
  }
  return ret;
}